

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::GetItemAccessors
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,ES5Array *arr,DynamicObject *instance,
          uint32 index,Var *getter,Var *setter)

{
  Var pvVar1;
  bool bVar2;
  BOOL BVar3;
  uint uVar4;
  IndexPropertyDescriptor *local_38;
  IndexPropertyDescriptor *descriptor;
  
  bVar2 = IndexPropertyDescriptorMap::TryGetReference((this->indexPropertyMap).ptr,index,&local_38);
  uVar4 = 0;
  if ((bVar2) && ((local_38->Attributes & 8) == 0)) {
    BVar3 = HasDataItem(this,arr,index);
    uVar4 = 0;
    if (BVar3 == 0) {
      *getter = (local_38->Getter).ptr;
      pvVar1 = (local_38->Setter).ptr;
      *setter = pvVar1;
      if ((local_38->Getter).ptr == (void *)0x0) {
        uVar4 = (uint)(pvVar1 != (Var)0x0);
      }
      else {
        uVar4 = 1;
      }
    }
  }
  return uVar4;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::GetItemAccessors(ES5Array* arr, DynamicObject* instance, uint32 index, Var* getter, Var* setter)
    {
        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                return false;
            }

            if (!HasDataItem(arr, index)) // if not shadowed by data item
            {
                *getter = descriptor->Getter;
                *setter = descriptor->Setter;
                return descriptor->Getter || descriptor->Setter;
            }
        }

        return false;
    }